

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O3

bool __thiscall deqp::sl::ShaderCase::execute(ShaderCase *this)

{
  Value *val;
  ostringstream *poVar1;
  bool bVar2;
  ExpectResult EVar3;
  DataType dataType;
  RenderContext *pRVar4;
  pointer pVVar5;
  _Alloc_hider __s;
  pointer pEVar6;
  pointer pfVar7;
  byte bVar8;
  ShaderCase *pSVar9;
  bool bVar10;
  int iVar11;
  deUint32 dVar12;
  GLenum GVar13;
  GLint GVar14;
  DataType DVar15;
  uint uVar16;
  undefined4 extraout_var;
  int *piVar17;
  TextureFormat *pTVar18;
  size_t sVar19;
  TestError *this_00;
  TextureFormat TVar20;
  Surface *surface_00;
  void *__buf;
  uint uVar21;
  long lVar22;
  char *__s_00;
  pointer pVVar23;
  bool bVar24;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  void *data;
  int iVar28;
  int iVar29;
  pointer pVVar30;
  vector<float,_std::allocator<float>_> *this_01;
  float fVar31;
  float fVar32;
  string attribPrefix;
  string attribName;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vertexArrays;
  Surface surface;
  ProgramSources sources;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  attribValues;
  Random rnd;
  ShaderProgram program;
  value_type local_390;
  GLuint local_36c;
  ulong local_368;
  value_type local_360;
  TextureFormat local_340;
  ShaderCase *local_338;
  int local_32c;
  int local_328;
  int local_324;
  ulong local_320;
  int local_314;
  int local_310;
  int local_30c;
  int local_308;
  GLint local_304;
  uint local_300;
  uint local_2fc;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> local_2f8;
  Surface local_2d8;
  long local_2c0;
  undefined1 local_2b8 [8];
  TextureFormat local_2b0;
  undefined1 local_2a8 [8];
  undefined1 auStack_2a0 [16];
  undefined1 local_290 [8];
  undefined1 local_288 [72];
  ios_base local_240 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_228;
  undefined1 local_208 [208];
  pointer local_138;
  ulong local_130;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_128;
  deRandom local_110;
  ShaderProgram local_100;
  Functions *gl;
  undefined4 extraout_var_00;
  
  local_340 = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar11 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar11);
  iVar11 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  piVar17 = (int *)CONCAT44(extraout_var_00,iVar11);
  dVar12 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_110,dVar12);
  iVar11 = *piVar17;
  local_32c = 0x80;
  if (iVar11 < 0x80) {
    local_32c = iVar11;
  }
  iVar26 = 0x80;
  if (piVar17[1] < 0x80) {
    iVar26 = piVar17[1];
  }
  dVar12 = deRandom_getUint32(&local_110);
  uVar25 = dVar12 % ((iVar11 - local_32c) + 1U);
  iVar11 = piVar17[1];
  dVar12 = deRandom_getUint32(&local_110);
  uVar21 = dVar12 % ((iVar11 - iVar26) + 1U);
  GVar13 = (*gl->getError)();
  glu::checkError(GVar13,"ShaderCase::execute(): start",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                  ,0x117);
  local_328 = iVar26;
  local_300 = uVar21;
  local_2fc = uVar25;
  (*gl->viewport)(uVar25,uVar21,local_32c,iVar26);
  pRVar4 = this->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,(this->m_vertexSource)._M_dataplus._M_p,
             (allocator<char> *)&local_2f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,(this->m_fragmentSource)._M_dataplus._M_p,
             (allocator<char> *)&local_128);
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_2b8,0,0xac);
  local_208._0_8_ = (pointer)0x0;
  local_208[8] = 0;
  local_208._9_7_ = 0;
  local_208[0x10] = 0;
  local_208._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2b8,&local_390);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_2a0,&local_360);
  glu::ShaderProgram::ShaderProgram(&local_100,pRVar4,(ProgramSources *)local_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_208);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_228);
  lVar22 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2b8 + lVar22));
    lVar22 = lVar22 + -0x18;
  } while (lVar22 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  bVar10 = ((*local_100.m_shaders[0].
              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
              super__Vector_impl_data._M_start)->m_info).compileOk;
  bVar2 = ((*local_100.m_shaders[1].
             super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
             super__Vector_impl_data._M_start)->m_info).compileOk;
  glu::operator<<((TestLog *)local_340,&local_100);
  EVar3 = this->m_expectResult;
  local_338 = this;
  if (EVar3 == EXPECT_PASS) {
    __s_00 = "expected shaders to compile and link properly, but failed to compile.";
    if ((bVar10 & bVar2) != 0) {
      __s_00 = "expected shaders to compile and link properly, but failed to link.";
    }
    if ((bVar10 & bVar2 & local_100.m_program.m_info.linkOk) != 0) {
      local_36c = local_100.m_program.m_program;
      (*gl->useProgram)(local_100.m_program.m_program);
      GVar13 = (*gl->getError)();
      glu::checkError(GVar13,"glUseProgram()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                      ,0x15d);
      GVar14 = (*gl->getAttribLocation)(local_36c,"dEQP_Position");
      if (GVar14 == -1) {
        local_2b8 = (undefined1  [8])local_2a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2b8,"no location found for attribute \'dEQP_Position\'","");
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)local_2b8,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                   ,0x164);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      pVVar30 = (this->m_valueBlocks).
                super__Vector_base<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar23 = (this->m_valueBlocks).
                super__Vector_base<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (0 < (int)((ulong)((long)pVVar23 - (long)pVVar30) >> 5)) {
        fVar31 = (float)local_328;
        fVar32 = ceilf(fVar31 * 0.0 + 1.0);
        local_308 = (int)fVar32;
        fVar31 = floorf(fVar31 + -0.5);
        local_30c = (int)fVar31;
        fVar31 = (float)local_32c;
        fVar32 = ceilf(fVar31 * 0.0 + 1.0);
        local_310 = (int)fVar32;
        fVar31 = floorf(fVar31 + -0.5);
        local_314 = (int)fVar31;
        lVar22 = 0;
        local_304 = GVar14;
        do {
          local_2c0 = lVar22;
          if (0 < pVVar30[lVar22].arrayLength) {
            pVVar30 = pVVar30 + lVar22;
            local_368 = 0;
            local_138 = pVVar30;
            do {
              local_320 = ((long)(pVVar30->values).
                                 super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pVVar30->values).
                                 super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x71c71c71c71c71c7;
              local_2f8.
              super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
              _M_impl.super__Vector_impl_data._M_start = (VertexArrayBinding *)0x0;
              local_2f8.
              super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_2f8.
              super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ::vector(&local_128,(long)(int)local_320,(allocator_type *)local_2b8);
              local_2b8 = (undefined1  [8])((ulong)local_2b8 & 0xffffffff00000000);
              local_2a8 = (undefined1  [8])0x0;
              auStack_2a0._0_8_ = auStack_2a0._0_8_ & 0xffffffffffffff00;
              local_288._0_8_ = (pointer)0x8;
              local_288._8_4_ = 4;
              local_288._12_4_ = 4;
              local_288._16_4_ = R;
              local_288._24_8_ = execute::s_positions;
              local_2b0 = (TextureFormat)auStack_2a0;
              local_290._0_4_ = GVar14;
              std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
              emplace_back<glu::VertexArrayBinding>(&local_2f8,(VertexArrayBinding *)local_2b8);
              if (local_2b0 != (TextureFormat)auStack_2a0) {
                operator_delete((void *)local_2b0,(ulong)(auStack_2a0._0_8_ + 1));
              }
              if (0 < (int)(uint)local_320) {
                local_320 = (ulong)((uint)local_320 & 0x7fffffff);
                uVar27 = 0;
                local_324 = 0;
                do {
                  pVVar5 = (pVVar30->values).
                           super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  __s._M_p = pVVar5[uVar27].valueName._M_dataplus._M_p;
                  dataType = pVVar5[uVar27].dataType;
                  local_130 = uVar27;
                  uVar21 = glu::getDataTypeScalarSize(dataType);
                  GVar13 = (*gl->getError)();
                  glu::checkError(GVar13,"before set uniforms",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                                  ,0x17f);
                  val = pVVar5 + uVar27;
                  if (val->storageType == STORAGE_OUTPUT) {
                    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"ref_","");
                    pTVar18 = (TextureFormat *)std::__cxx11::string::append((char *)&local_390);
                    local_2b8 = (undefined1  [8])local_2a8;
                    TVar20 = (TextureFormat)(pTVar18 + 2);
                    if (*pTVar18 == TVar20) {
                      local_2a8 = *(undefined1 (*) [8])TVar20;
                      auStack_2a0._0_8_ = pTVar18[3];
                    }
                    else {
                      local_2a8 = *(undefined1 (*) [8])TVar20;
                      local_2b8 = (undefined1  [8])*pTVar18;
                    }
                    local_2b0 = pTVar18[1];
                    *pTVar18 = TVar20;
                    pTVar18[1].order = R;
                    pTVar18[1].type = SNORM_INT8;
                    *(undefined1 *)&pTVar18[2].order = R;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_390._M_dataplus._M_p != &local_390.field_2) {
                      operator_delete(local_390._M_dataplus._M_p,
                                      local_390.field_2._M_allocated_capacity + 1);
                    }
                    setUniformValue(gl,local_36c,(string *)local_2b8,val,(int)local_368);
                    GVar13 = (*gl->getError)();
                    glu::checkError(GVar13,"set reference uniforms",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                                    ,0x1c3);
                    if (local_2b8 != (undefined1  [8])local_2a8) {
                      operator_delete((void *)local_2b8,(ulong)((long)local_2a8 + 1));
                    }
                  }
                  else if (val->storageType == STORAGE_INPUT) {
                    this_01 = local_128.
                              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + local_324;
                    std::vector<float,_std::allocator<float>_>::resize
                              (this_01,(long)(int)(uVar21 * 4));
                    if ((dataType - TYPE_FLOAT < 4) ||
                       (dataType - TYPE_DOUBLE_MAT2 < 9 || dataType - TYPE_FLOAT_MAT2 < 9)) {
                      iVar11 = 0;
                      iVar26 = 0;
                      do {
                        if (0 < (int)uVar21) {
                          pEVar6 = (val->elements).
                                   super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          pfVar7 = (this_01->super__Vector_base<float,_std::allocator<float>_>).
                                   _M_impl.super__Vector_impl_data._M_start;
                          uVar27 = (ulong)uVar21;
                          iVar28 = (int)local_368 * uVar21;
                          iVar29 = iVar11;
                          do {
                            *(Element *)(pfVar7 + iVar29) = pEVar6[iVar28];
                            iVar29 = iVar29 + 1;
                            iVar28 = iVar28 + 1;
                            uVar27 = uVar27 - 1;
                          } while (uVar27 != 0);
                        }
                        iVar26 = iVar26 + 1;
                        iVar11 = iVar11 + uVar21;
                      } while (iVar26 != 4);
                    }
                    else {
                      iVar11 = 0;
                      iVar26 = 0;
                      do {
                        if (0 < (int)uVar21) {
                          pEVar6 = (val->elements).
                                   super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          pfVar7 = (this_01->super__Vector_base<float,_std::allocator<float>_>).
                                   _M_impl.super__Vector_impl_data._M_start;
                          uVar27 = (ulong)uVar21;
                          iVar28 = (int)local_368 * uVar21;
                          iVar29 = iVar11;
                          do {
                            pfVar7[iVar29] = (float)pEVar6[iVar28].int32;
                            iVar29 = iVar29 + 1;
                            iVar28 = iVar28 + 1;
                            uVar27 = uVar27 - 1;
                          } while (uVar27 != 0);
                        }
                        iVar26 = iVar26 + 1;
                        iVar11 = iVar11 + uVar21;
                      } while (iVar26 != 4);
                    }
                    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_390);
                    if ((local_338->m_caseType == CASETYPE_FRAGMENT_ONLY) ||
                       (DVar15 = glu::getDataTypeScalarType(dataType), DVar15 != TYPE_FLOAT)) {
                      std::__cxx11::string::_M_replace
                                ((ulong)&local_390,0,(char *)local_390._M_string_length,0x1cb8d10);
                    }
                    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_360,local_390._M_dataplus._M_p,
                               (char *)(local_390._M_string_length +
                                       (long)local_390._M_dataplus._M_p));
                    std::__cxx11::string::append((char *)&local_360);
                    GVar14 = (*gl->getAttribLocation)(local_36c,local_360._M_dataplus._M_p);
                    if (GVar14 == -1) {
                      local_2b8._0_4_ = local_340.order;
                      local_2b8._4_4_ = local_340.type;
                      poVar1 = (ostringstream *)(local_2b8 + 8);
                      std::__cxx11::ostringstream::ostringstream(poVar1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)poVar1,"Warning: no location found for attribute \'",
                                 0x2a);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)poVar1,local_360._M_dataplus._M_p,
                                 local_360._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\'",1);
                      tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_2b8,
                                 (EndMessageToken *)&tcu::TestLog::EndMessage);
                      std::__cxx11::ostringstream::~ostringstream(poVar1);
                      std::ios_base::~ios_base(local_240);
                    }
                    else {
                      if (dataType - TYPE_FLOAT_MAT2 < 9 || dataType - TYPE_DOUBLE_MAT2 < 9) {
                        uVar25 = glu::getDataTypeMatrixNumColumns(dataType);
                        uVar16 = glu::getDataTypeMatrixNumRows(dataType);
                        if (0 < (int)uVar25) {
                          uVar27 = (ulong)uVar25;
                          iVar11 = 0;
                          do {
                            local_288._24_8_ =
                                 (this_01->super__Vector_base<float,_std::allocator<float>_>).
                                 _M_impl.super__Vector_impl_data._M_start + iVar11;
                            local_2b8 = (undefined1  [8])((ulong)local_2b8 & 0xffffffff00000000);
                            local_2a8 = (undefined1  [8])0x0;
                            auStack_2a0._0_8_ = auStack_2a0._0_8_ & 0xffffffffffffff00;
                            local_288._0_8_ = (pointer)0x8;
                            local_288._12_4_ = 4;
                            local_2b0 = (TextureFormat)auStack_2a0;
                            local_290._0_4_ = GVar14;
                            local_288._8_4_ = uVar16;
                            local_288._16_4_ = uVar21 * 4;
                            std::
                            vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                            ::emplace_back<glu::VertexArrayBinding>
                                      (&local_2f8,(VertexArrayBinding *)local_2b8);
                            if (local_2b0 != (TextureFormat)auStack_2a0) {
                              operator_delete((void *)local_2b0,(ulong)(auStack_2a0._0_8_ + 1));
                            }
                            iVar11 = iVar11 + uVar16;
                            GVar14 = GVar14 + 1;
                            uVar27 = uVar27 - 1;
                          } while (uVar27 != 0);
                        }
                      }
                      else {
                        local_288._24_8_ =
                             (this_01->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                             super__Vector_impl_data._M_start;
                        local_2b8 = (undefined1  [8])((ulong)local_2b8 & 0xffffffff00000000);
                        local_2a8 = (undefined1  [8])0x0;
                        auStack_2a0._0_8_ = auStack_2a0._0_8_ & 0xffffffffffffff00;
                        local_288._0_8_ = (pointer)0x8;
                        local_288._12_4_ = 4;
                        local_288._16_4_ = R;
                        local_2b0 = (TextureFormat)auStack_2a0;
                        local_290._0_4_ = GVar14;
                        local_288._8_4_ = uVar21;
                        std::
                        vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
                        emplace_back<glu::VertexArrayBinding>
                                  (&local_2f8,(VertexArrayBinding *)local_2b8);
                        if (local_2b0 != (TextureFormat)auStack_2a0) {
                          operator_delete((void *)local_2b0,(ulong)(auStack_2a0._0_8_ + 1));
                        }
                      }
                      GVar13 = (*gl->getError)();
                      glu::checkError(GVar13,"set vertex attrib array",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                                      ,0x1bc);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_360._M_dataplus._M_p != &local_360.field_2) {
                      operator_delete(local_360._M_dataplus._M_p,
                                      local_360.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_390._M_dataplus._M_p != &local_390.field_2) {
                      operator_delete(local_390._M_dataplus._M_p,
                                      local_390.field_2._M_allocated_capacity + 1);
                    }
                    local_324 = local_324 + 1;
                  }
                  else {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)local_2b8,__s._M_p,(allocator<char> *)&local_390);
                    setUniformValue(gl,local_36c,(string *)local_2b8,val,(int)local_368);
                    if (local_2b8 != (undefined1  [8])local_2a8) {
                      operator_delete((void *)local_2b8,(ulong)((long)local_2a8 + 1));
                    }
                    GVar13 = (*gl->getError)();
                    glu::checkError(GVar13,"set uniforms",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                                    ,0x1c9);
                  }
                  uVar27 = local_130 + 1;
                  pVVar30 = local_138;
                } while (uVar27 != local_320);
              }
              (*gl->clearColor)(0.0,0.0,0.0,1.0);
              pSVar9 = local_338;
              (*gl->clear)(0x4000);
              GVar13 = (*gl->getError)();
              glu::checkError(GVar13,"clear buffer",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                              ,0x1d0);
              local_2b8._0_4_ = R;
              local_2b8._4_4_ = UNORM_INT32;
              local_2b0.order = 1;
              local_2a8 = (undefined1  [8])execute::s_indices;
              glu::draw(pSVar9->m_renderCtx,local_100.m_program.m_program,
                        (int)((ulong)((long)local_2f8.
                                            super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_2f8.
                                           super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                        -0x33333333,
                        local_2f8.
                        super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                        ._M_impl.super__Vector_impl_data._M_start,(PrimitiveList *)local_2b8,
                        (DrawUtilCallback *)0x0);
              GVar13 = (*gl->getError)();
              glu::checkError(GVar13,"draw",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                              ,0x1d5);
              tcu::Surface::Surface(&local_2d8,local_32c,local_328);
              pRVar4 = pSVar9->m_renderCtx;
              local_390._M_dataplus._M_p = (pointer)0x300000008;
              data = (void *)local_2d8.m_pixels.m_cap;
              if ((void *)local_2d8.m_pixels.m_cap != (void *)0x0) {
                data = local_2d8.m_pixels.m_ptr;
              }
              tcu::PixelBufferAccess::PixelBufferAccess
                        ((PixelBufferAccess *)local_2b8,(TextureFormat *)&local_390,
                         local_2d8.m_width,local_2d8.m_height,1,data);
              GVar14 = local_304;
              glu::readPixels(pRVar4,local_2fc,local_300,(PixelBufferAccess *)local_2b8);
              GVar13 = (*gl->getError)();
              glu::checkError(GVar13,"read pixels",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                              ,0x1da);
              bVar10 = checkPixels(local_338,&local_2d8,local_310,local_314,local_308,local_30c);
              if (!bVar10) {
                poVar1 = (ostringstream *)(local_2b8 + 8);
                local_2b8._0_4_ = local_340.order;
                local_2b8._4_4_ = local_340.type;
                std::__cxx11::ostringstream::ostringstream(poVar1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1,"INCORRECT RESULT for (value block ",0x22);
                pSVar9 = local_338;
                std::ostream::operator<<(poVar1,(int)local_2c0 + 1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," of ",4);
                std::ostream::operator<<
                          (poVar1,(int)((ulong)((long)(pSVar9->m_valueBlocks).
                                                                                                            
                                                  super__Vector_base<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)(pSVar9->m_valueBlocks).
                                                                                                          
                                                  super__Vector_base<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 5));
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1,", sub-case ",0xb);
                std::ostream::operator<<(poVar1,(int)local_368 + 1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," of ",4);
                std::ostream::operator<<(poVar1,pVVar30->arrayLength);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"):",2);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream(poVar1);
                std::ios_base::~ios_base(local_240);
                local_2b8._0_4_ = local_340.order;
                local_2b8._4_4_ = local_340.type;
                poVar1 = (ostringstream *)(local_2b8 + 8);
                std::__cxx11::ostringstream::ostringstream(poVar1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1,"Failing shader input/output values:",0x23);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream(poVar1);
                std::ios_base::~ios_base(local_240);
                dumpValues(pSVar9,pVVar30,(int)local_368);
                local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"Result","");
                local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_360,"Rendered result image","");
                surface_00 = &local_2d8;
                tcu::LogImage::LogImage
                          ((LogImage *)local_2b8,&local_390,&local_360,surface_00,
                           QP_IMAGE_COMPRESSION_MODE_BEST);
                tcu::LogImage::write((LogImage *)local_2b8,local_340.order,__buf,(size_t)surface_00)
                ;
                if ((pointer)auStack_2a0._8_8_ != (pointer)local_288) {
                  operator_delete((void *)auStack_2a0._8_8_,(ulong)(local_288._0_8_ + 1));
                }
                if (local_2b8 != (undefined1  [8])local_2a8) {
                  operator_delete((void *)local_2b8,(ulong)((long)local_2a8 + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_360._M_dataplus._M_p != &local_360.field_2) {
                  operator_delete(local_360._M_dataplus._M_p,
                                  local_360.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_390._M_dataplus._M_p != &local_390.field_2) {
                  operator_delete(local_390._M_dataplus._M_p,
                                  local_390.field_2._M_allocated_capacity + 1);
                }
                (*gl->useProgram)(0);
                tcu::TestContext::setTestResult
                          ((pSVar9->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                           "Image comparison failed");
                tcu::Surface::~Surface(&local_2d8);
                std::
                vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ::~vector(&local_128);
                std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
                ~vector(&local_2f8);
                goto LAB_00daa997;
              }
              tcu::Surface::~Surface(&local_2d8);
              std::
              vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ::~vector(&local_128);
              std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
              ~vector(&local_2f8);
              uVar21 = (int)local_368 + 1;
              local_368 = (ulong)uVar21;
            } while ((int)uVar21 < pVVar30->arrayLength);
            pVVar30 = (local_338->m_valueBlocks).
                      super__Vector_base<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pVVar23 = (local_338->m_valueBlocks).
                      super__Vector_base<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          lVar22 = local_2c0 + 1;
        } while (lVar22 < (int)((ulong)((long)pVVar23 - (long)pVVar30) >> 5));
      }
      (*gl->useProgram)(0);
      GVar13 = (*gl->getError)();
      bVar24 = true;
      glu::checkError(GVar13,"ShaderCase::execute(): end",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                      ,0x1f6);
      goto LAB_00daa999;
    }
LAB_00daa8ef:
    poVar1 = (ostringstream *)(local_2b8 + 8);
    local_2b8._0_4_ = local_340.order;
    local_2b8._4_4_ = local_340.type;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"ERROR: ",7);
    sVar19 = strlen(__s_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,__s_00,sVar19);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_240);
    tcu::TestContext::setTestResult
              ((local_338->super_TestCase).super_TestNode.m_testCtx,
               QP_TEST_RESULT_QUALITY_WARNING -
               ((byte)(~bVar2 | local_100.m_program.m_info.linkOk |
                      ~bVar10 | local_338->m_expectResult != EXPECT_COMPILE_FAIL) & 1),__s_00);
  }
  else {
    if (EVar3 == EXPECT_COMPILE_FAIL) {
      __s_00 = "expected compilation to fail, but both shaders compiled and link failed.";
      if ((local_100.m_program.m_info.linkOk & 1U) != 0) {
        __s_00 = "expected compilation to fail, but both shaders compiled correctly.";
      }
      bVar8 = bVar10 & bVar2;
joined_r0x00da9db9:
      bVar24 = true;
      if (bVar8 == 0) goto LAB_00daa999;
      goto LAB_00daa8ef;
    }
    if (EVar3 == EXPECT_LINK_FAIL) {
      __s_00 = "expected linking to fail, but unable to compile.";
      if ((bVar10 & bVar2) != 0) {
        __s_00 = "expected linking to fail, but passed.";
      }
      bVar8 = (~(bVar10 & bVar2) | local_100.m_program.m_info.linkOk) & 1;
      goto joined_r0x00da9db9;
    }
  }
LAB_00daa997:
  bVar24 = false;
LAB_00daa999:
  glu::ShaderProgram::~ShaderProgram(&local_100);
  return bVar24;
}

Assistant:

bool ShaderCase::execute(void)
{
	TestLog&			  log = m_testCtx.getLog();
	const glw::Functions& gl  = m_renderCtx.getFunctions();

	// Compute viewport.
	const tcu::RenderTarget& renderTarget = m_renderCtx.getRenderTarget();
	de::Random				 rnd(deStringHash(getName()));
	int						 width				= deMin32(renderTarget.getWidth(), VIEWPORT_WIDTH);
	int						 height				= deMin32(renderTarget.getHeight(), VIEWPORT_HEIGHT);
	int						 viewportX			= rnd.getInt(0, renderTarget.getWidth() - width);
	int						 viewportY			= rnd.getInt(0, renderTarget.getHeight() - height);
	const int				 numVerticesPerDraw = 4;

	GLU_EXPECT_NO_ERROR(gl.getError(), "ShaderCase::execute(): start");

	// Setup viewport.
	gl.viewport(viewportX, viewportY, width, height);

	const float		   quadSize			  = 1.0f;
	static const float s_positions[4 * 4] = { -quadSize, -quadSize, 0.0f, 1.0f, -quadSize, +quadSize, 0.0f, 1.0f,
											  +quadSize, -quadSize, 0.0f, 1.0f, +quadSize, +quadSize, 0.0f, 1.0f };

	static const deUint16 s_indices[2 * 3] = { 0, 1, 2, 1, 3, 2 };

	// Setup program.
	glu::ShaderProgram program(m_renderCtx, glu::makeVtxFragSources(m_vertexSource.c_str(), m_fragmentSource.c_str()));

	// Check that compile/link results are what we expect.
	bool		vertexOk   = program.getShaderInfo(SHADERTYPE_VERTEX).compileOk;
	bool		fragmentOk = program.getShaderInfo(SHADERTYPE_FRAGMENT).compileOk;
	bool		linkOk	 = program.getProgramInfo().linkOk;
	const char* failReason = DE_NULL;

	log << program;

	switch (m_expectResult)
	{
	case EXPECT_PASS:
		if (!vertexOk || !fragmentOk)
			failReason = "expected shaders to compile and link properly, but failed to compile.";
		else if (!linkOk)
			failReason = "expected shaders to compile and link properly, but failed to link.";
		break;

	case EXPECT_COMPILE_FAIL:
		if (vertexOk && fragmentOk && !linkOk)
			failReason = "expected compilation to fail, but both shaders compiled and link failed.";
		else if (vertexOk && fragmentOk)
			failReason = "expected compilation to fail, but both shaders compiled correctly.";
		break;

	case EXPECT_LINK_FAIL:
		if (!vertexOk || !fragmentOk)
			failReason = "expected linking to fail, but unable to compile.";
		else if (linkOk)
			failReason = "expected linking to fail, but passed.";
		break;

	default:
		DE_ASSERT(false);
		return false;
	}

	if (failReason != DE_NULL)
	{
		// \todo [2010-06-07 petri] These should be handled in the test case?
		log << TestLog::Message << "ERROR: " << failReason << TestLog::EndMessage;

		// If implementation parses shader at link time, report it as quality warning.
		if (m_expectResult == EXPECT_COMPILE_FAIL && vertexOk && fragmentOk && !linkOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, failReason);
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, failReason);
		return false;
	}

	// Return if compile/link expected to fail.
	if (m_expectResult != EXPECT_PASS)
		return (failReason == DE_NULL);

	// Start using program.
	deUint32 programID = program.getProgram();
	gl.useProgram(programID);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram()");

	// Fetch location for positions positions.
	int positionLoc = gl.getAttribLocation(programID, "dEQP_Position");
	if (positionLoc == -1)
	{
		string errStr = string("no location found for attribute 'dEQP_Position'");
		TCU_FAIL(errStr.c_str());
	}

	// Iterate all value blocks.
	for (int blockNdx = 0; blockNdx < (int)m_valueBlocks.size(); blockNdx++)
	{
		const ValueBlock& valueBlock = m_valueBlocks[blockNdx];

		// Iterate all array sub-cases.
		for (int arrayNdx = 0; arrayNdx < valueBlock.arrayLength; arrayNdx++)
		{
			int						   numValues = (int)valueBlock.values.size();
			vector<VertexArrayBinding> vertexArrays;

			int					   attribValueNdx = 0;
			vector<vector<float> > attribValues(numValues);

			vertexArrays.push_back(va::Float(positionLoc, 4, numVerticesPerDraw, 0, &s_positions[0]));

			// Collect VA pointer for inputs and set uniform values for outputs (refs).
			for (int valNdx = 0; valNdx < numValues; valNdx++)
			{
				const ShaderCase::Value& val		= valueBlock.values[valNdx];
				const char*				 valueName  = val.valueName.c_str();
				DataType				 dataType   = val.dataType;
				int						 scalarSize = getDataTypeScalarSize(val.dataType);

				GLU_EXPECT_NO_ERROR(gl.getError(), "before set uniforms");

				if (val.storageType == ShaderCase::Value::STORAGE_INPUT)
				{
					// Replicate values four times.
					std::vector<float>& scalars = attribValues[attribValueNdx++];
					scalars.resize(numVerticesPerDraw * scalarSize);
					if (isDataTypeFloatOrVec(dataType) || isDataTypeMatrix(dataType))
					{
						for (int repNdx = 0; repNdx < numVerticesPerDraw; repNdx++)
							for (int ndx						   = 0; ndx < scalarSize; ndx++)
								scalars[repNdx * scalarSize + ndx] = val.elements[arrayNdx * scalarSize + ndx].float32;
					}
					else
					{
						// convert to floats.
						for (int repNdx = 0; repNdx < numVerticesPerDraw; repNdx++)
						{
							for (int ndx = 0; ndx < scalarSize; ndx++)
							{
								float v = (float)val.elements[arrayNdx * scalarSize + ndx].int32;
								DE_ASSERT(val.elements[arrayNdx * scalarSize + ndx].int32 == (int)v);
								scalars[repNdx * scalarSize + ndx] = v;
							}
						}
					}

					// Attribute name prefix.
					string attribPrefix = "";
					// \todo [2010-05-27 petri] Should latter condition only apply for vertex cases (or actually non-fragment cases)?
					if ((m_caseType == CASETYPE_FRAGMENT_ONLY) || (getDataTypeScalarType(dataType) != TYPE_FLOAT))
						attribPrefix = "a_";

					// Input always given as attribute.
					string attribName = attribPrefix + valueName;
					int	attribLoc  = gl.getAttribLocation(programID, attribName.c_str());
					if (attribLoc == -1)
					{
						log << TestLog::Message << "Warning: no location found for attribute '" << attribName << "'"
							<< TestLog::EndMessage;
						continue;
					}

					if (isDataTypeMatrix(dataType))
					{
						int numCols = getDataTypeMatrixNumColumns(dataType);
						int numRows = getDataTypeMatrixNumRows(dataType);
						DE_ASSERT(scalarSize == numCols * numRows);

						for (int i = 0; i < numCols; i++)
							vertexArrays.push_back(va::Float(attribLoc + i, numRows, numVerticesPerDraw,
															 static_cast<int>(scalarSize * sizeof(float)),
															 &scalars[i * numRows]));
					}
					else
					{
						DE_ASSERT(isDataTypeFloatOrVec(dataType) || isDataTypeIntOrIVec(dataType) ||
								  isDataTypeUintOrUVec(dataType) || isDataTypeBoolOrBVec(dataType));
						vertexArrays.push_back(va::Float(attribLoc, scalarSize, numVerticesPerDraw, 0, &scalars[0]));
					}

					GLU_EXPECT_NO_ERROR(gl.getError(), "set vertex attrib array");
				}
				else if (val.storageType == ShaderCase::Value::STORAGE_OUTPUT)
				{
					// Set reference value.
					string refName = string("ref_") + valueName;
					setUniformValue(gl, programID, refName, val, arrayNdx);
					GLU_EXPECT_NO_ERROR(gl.getError(), "set reference uniforms");
				}
				else
				{
					DE_ASSERT(val.storageType == ShaderCase::Value::STORAGE_UNIFORM);
					setUniformValue(gl, programID, valueName, val, arrayNdx);
					GLU_EXPECT_NO_ERROR(gl.getError(), "set uniforms");
				}
			}

			// Clear.
			gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "clear buffer");

			// Draw.
			draw(m_renderCtx, program.getProgram(), (int)vertexArrays.size(), &vertexArrays[0],
				 pr::Triangles(DE_LENGTH_OF_ARRAY(s_indices), &s_indices[0]));
			GLU_EXPECT_NO_ERROR(gl.getError(), "draw");

			// Read back results.
			Surface surface(width, height);
			glu::readPixels(m_renderCtx, viewportX, viewportY, surface.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "read pixels");

			float w	= s_positions[3];
			int   minY = deCeilFloatToInt32(((-quadSize / w) * 0.5f + 0.5f) * (float)height + 1.0f);
			int   maxY = deFloorFloatToInt32(((+quadSize / w) * 0.5f + 0.5f) * (float)height - 0.5f);
			int   minX = deCeilFloatToInt32(((-quadSize / w) * 0.5f + 0.5f) * (float)width + 1.0f);
			int   maxX = deFloorFloatToInt32(((+quadSize / w) * 0.5f + 0.5f) * (float)width - 0.5f);

			if (!checkPixels(surface, minX, maxX, minY, maxY))
			{
				log << TestLog::Message << "INCORRECT RESULT for (value block " << (blockNdx + 1) << " of "
					<< (int)m_valueBlocks.size() << ", sub-case " << arrayNdx + 1 << " of " << valueBlock.arrayLength
					<< "):" << TestLog::EndMessage;

				log << TestLog::Message << "Failing shader input/output values:" << TestLog::EndMessage;
				dumpValues(valueBlock, arrayNdx);

				// Dump image on failure.
				log << TestLog::Image("Result", "Rendered result image", surface);

				gl.useProgram(0);
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
				return false;
			}
		}
	}

	gl.useProgram(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ShaderCase::execute(): end");
	return true;
}